

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Neuron.cpp
# Opt level: O0

void __thiscall
Neuron::Neuron(Neuron *this,float extI,float expireSpeedFired,float expireSpeedNotFired)

{
  float expireSpeedNotFired_local;
  float expireSpeedFired_local;
  float extI_local;
  Neuron *this_local;
  
  this->m_extI = extI;
  this->m_expireSpeedFired = expireSpeedFired;
  this->m_expireSpeedNotFired = expireSpeedNotFired;
  this->m_prevMem = -60.0;
  this->m_curMem = -60.0;
  this->m_synI = 0.0;
  this->m_prevAdd = 0.0;
  this->m_curAdd = 0.0;
  std::vector<Connection,_std::allocator<Connection>_>::vector(&this->m_connections);
  std::vector<Connection_*,_std::allocator<Connection_*>_>::vector(&this->m_incomingSpikes);
  this->m_refractoryPeriod = false;
  this->m_firing = false;
  std::
  vector<std::vector<Neuron_*,_std::allocator<Neuron_*>_>,_std::allocator<std::vector<Neuron_*,_std::allocator<Neuron_*>_>_>_>
  ::vector(&this->m_watchFor);
  return;
}

Assistant:

Neuron::Neuron(float extI, float expireSpeedFired, float expireSpeedNotFired)
    : m_extI(extI)
    , m_expireSpeedFired(expireSpeedFired)
    , m_expireSpeedNotFired(expireSpeedNotFired)
    , m_prevMem(kDefaultMembrane)
    , m_curMem(kDefaultMembrane)
{
}